

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::Arena::AddListNode(Arena *this,void *elem,_func_void_void_ptr *cleanup)

{
  undefined8 *new_value;
  Atomic64 AVar1;
  Node *node;
  _func_void_void_ptr *cleanup_local;
  void *elem_local;
  Arena *this_local;
  
  new_value = (undefined8 *)AllocateAligned(this,(type_info *)0x0,0x18);
  *new_value = elem;
  new_value[1] = cleanup;
  AVar1 = internal::NoBarrier_AtomicExchange((Atomic64 *)(this + 0x20),(Atomic64)new_value);
  new_value[2] = AVar1;
  return;
}

Assistant:

void Arena::AddListNode(void* elem, void (*cleanup)(void*)) {
  Node* node = reinterpret_cast<Node*>(AllocateAligned(sizeof(Node)));
  node->elem = elem;
  node->cleanup = cleanup;
  node->next = reinterpret_cast<Node*>(
      google::protobuf::internal::NoBarrier_AtomicExchange(&cleanup_list_,
            reinterpret_cast<google::protobuf::internal::AtomicWord>(node)));
}